

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void prescan_quantize(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows
                     )

{
  short sVar1;
  JDIMENSION JVar2;
  _func_void_j_decompress_ptr *p_Var3;
  short sVar4;
  ulong uVar5;
  byte *pbVar6;
  JDIMENSION JVar7;
  long lVar8;
  
  if (0 < num_rows) {
    p_Var3 = cinfo->cquantize[1].finish_pass;
    JVar2 = cinfo->output_width;
    uVar5 = 0;
    do {
      if (JVar2 != 0) {
        pbVar6 = input_buf[uVar5];
        JVar7 = JVar2;
        do {
          lVar8 = (ulong)((pbVar6[1] & 0xffffffc) << 4) + *(long *)(p_Var3 + (*pbVar6 & 0xfffffff8))
          ;
          sVar1 = *(short *)(lVar8 + (ulong)(pbVar6[2] >> 3) * 2);
          sVar4 = sVar1 + 1;
          if (sVar4 == 0) {
            sVar4 = sVar1;
          }
          *(short *)(lVar8 + (ulong)(pbVar6[2] >> 3) * 2) = sVar4;
          pbVar6 = pbVar6 + 3;
          JVar7 = JVar7 - 1;
        } while (JVar7 != 0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
prescan_quantize(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                 JSAMPARRAY output_buf, int num_rows)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register JSAMPROW ptr;
  register histptr histp;
  register hist3d histogram = cquantize->histogram;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptr = input_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the histogram */
      histp = &histogram[ptr[0] >> C0_SHIFT]
                        [ptr[1] >> C1_SHIFT]
                        [ptr[2] >> C2_SHIFT];
      /* increment, check for overflow and undo increment if so. */
      if (++(*histp) <= 0)
        (*histp)--;
      ptr += 3;
    }
  }
}